

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

ENetHost *
enet_host_create(ENetAddress *address,size_t peerCount,size_t channelLimit,
                enet_uint32 incomingBandwidth,enet_uint32 outgoingBandwidth)

{
  enet_uint16 eVar1;
  ENetSocket EVar2;
  int iVar3;
  ENetPeer *pEVar4;
  enet_uint64 eVar5;
  ENetPeer *local_40;
  ENetPeer *currentPeer;
  ENetHost *host;
  enet_uint32 outgoingBandwidth_local;
  enet_uint32 incomingBandwidth_local;
  size_t channelLimit_local;
  size_t peerCount_local;
  ENetAddress *address_local;
  
  if (peerCount < 0x10000) {
    address_local = (ENetAddress *)enet_malloc(0x2b28);
    if ((_ENetHost *)address_local == (_ENetHost *)0x0) {
      address_local = (ENetAddress *)0x0;
    }
    else {
      memset(address_local,0,0x2b28);
      pEVar4 = (ENetPeer *)enet_malloc(peerCount * 0x1f8);
      ((_ENetHost *)address_local)->peers = pEVar4;
      if (((_ENetHost *)address_local)->peers == (ENetPeer *)0x0) {
        enet_free(address_local);
        address_local = (ENetAddress *)0x0;
      }
      else {
        memset(((_ENetHost *)address_local)->peers,0,peerCount * 0x1f8);
        EVar2 = enet_socket_create(ENET_SOCKET_TYPE_DATAGRAM);
        ((_ENetHost *)address_local)->socket = EVar2;
        if (((_ENetHost *)address_local)->socket != -1) {
          enet_socket_set_option(((_ENetHost *)address_local)->socket,ENET_SOCKOPT_IPV6_V6ONLY,0);
        }
        if ((((_ENetHost *)address_local)->socket == -1) ||
           ((address != (ENetAddress *)0x0 &&
            (iVar3 = enet_socket_bind(((_ENetHost *)address_local)->socket,address), iVar3 < 0)))) {
          if (((_ENetHost *)address_local)->socket != -1) {
            enet_socket_destroy(((_ENetHost *)address_local)->socket);
          }
          enet_free(((_ENetHost *)address_local)->peers);
          enet_free(address_local);
          address_local = (ENetAddress *)0x0;
        }
        else {
          enet_socket_set_option(((_ENetHost *)address_local)->socket,ENET_SOCKOPT_NONBLOCK,1);
          enet_socket_set_option(((_ENetHost *)address_local)->socket,ENET_SOCKOPT_BROADCAST,1);
          enet_socket_set_option(((_ENetHost *)address_local)->socket,ENET_SOCKOPT_RCVBUF,0x40000);
          enet_socket_set_option(((_ENetHost *)address_local)->socket,ENET_SOCKOPT_SNDBUF,0x40000);
          enet_socket_set_option(((_ENetHost *)address_local)->socket,ENET_SOCKOPT_IPV6_V6ONLY,0);
          if ((address != (ENetAddress *)0x0) &&
             (iVar3 = enet_socket_get_address
                                (((_ENetHost *)address_local)->socket,
                                 &((_ENetHost *)address_local)->address), iVar3 < 0)) {
            *(undefined8 *)&(((_ENetHost *)address_local)->address).host.__in6_u =
                 *(undefined8 *)&(address->host).__in6_u;
            *(undefined8 *)((long)&(((_ENetHost *)address_local)->address).host.__in6_u + 8) =
                 *(undefined8 *)((long)&(address->host).__in6_u + 8);
            eVar1 = address->sin6_scope_id;
            (((_ENetHost *)address_local)->address).port = address->port;
            (((_ENetHost *)address_local)->address).sin6_scope_id = eVar1;
          }
          if ((channelLimit == 0) || (_outgoingBandwidth_local = channelLimit, 0xff < channelLimit))
          {
            _outgoingBandwidth_local = 0xff;
          }
          ((_ENetHost *)address_local)->randomSeed =
               (enet_uint32)((ulong)address_local % 0xffffffff);
          eVar5 = enet_host_random_seed();
          ((_ENetHost *)address_local)->randomSeed =
               ((_ENetHost *)address_local)->randomSeed + (int)eVar5;
          ((_ENetHost *)address_local)->randomSeed =
               ((_ENetHost *)address_local)->randomSeed << 0x10 |
               ((_ENetHost *)address_local)->randomSeed >> 0x10;
          ((_ENetHost *)address_local)->channelLimit = _outgoingBandwidth_local;
          ((_ENetHost *)address_local)->incomingBandwidth = incomingBandwidth;
          ((_ENetHost *)address_local)->outgoingBandwidth = outgoingBandwidth;
          ((_ENetHost *)address_local)->bandwidthThrottleEpoch = 0;
          ((_ENetHost *)address_local)->recalculateBandwidthLimits = 0;
          ((_ENetHost *)address_local)->mtu = 0x570;
          ((_ENetHost *)address_local)->peerCount = peerCount;
          ((_ENetHost *)address_local)->commandCount = 0;
          ((_ENetHost *)address_local)->bufferCount = 0;
          ((_ENetHost *)address_local)->checksum = (ENetChecksumCallback)0x0;
          *(undefined8 *)&(((_ENetHost *)address_local)->receivedAddress).host.__in6_u =
               _in6addr_any;
          *(undefined8 *)((long)&(((_ENetHost *)address_local)->receivedAddress).host.__in6_u + 8) =
               _setsockopt;
          (((_ENetHost *)address_local)->receivedAddress).port = 0;
          ((_ENetHost *)address_local)->receivedData = (enet_uint8 *)0x0;
          ((_ENetHost *)address_local)->receivedDataLength = 0;
          ((_ENetHost *)address_local)->totalSentData = 0;
          ((_ENetHost *)address_local)->totalSentPackets = 0;
          ((_ENetHost *)address_local)->totalReceivedData = 0;
          ((_ENetHost *)address_local)->totalReceivedPackets = 0;
          ((_ENetHost *)address_local)->totalQueued = 0;
          ((_ENetHost *)address_local)->connectedPeers = 0;
          ((_ENetHost *)address_local)->bandwidthLimitedPeers = 0;
          ((_ENetHost *)address_local)->duplicatePeers = 0xffff;
          ((_ENetHost *)address_local)->maximumPacketSize = 0x2000000;
          ((_ENetHost *)address_local)->maximumWaitingData = 0x2000000;
          (((_ENetHost *)address_local)->compressor).context = (void *)0x0;
          (((_ENetHost *)address_local)->compressor).compress =
               (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *)0x0;
          (((_ENetHost *)address_local)->compressor).decompress =
               (_func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *)0x0;
          (((_ENetHost *)address_local)->compressor).destroy = (_func_void_void_ptr *)0x0;
          ((_ENetHost *)address_local)->intercept = (ENetInterceptCallback)0x0;
          enet_list_clear(&((_ENetHost *)address_local)->dispatchQueue);
          for (local_40 = ((_ENetHost *)address_local)->peers;
              local_40 <
              ((_ENetHost *)address_local)->peers + ((_ENetHost *)address_local)->peerCount;
              local_40 = local_40 + 1) {
            local_40->host = (_ENetHost *)address_local;
            local_40->incomingPeerID =
                 (enet_uint16)(((long)local_40 - (long)((_ENetHost *)address_local)->peers) / 0x1f8)
            ;
            local_40->incomingSessionID = 0xff;
            local_40->outgoingSessionID = 0xff;
            local_40->data = (void *)0x0;
            enet_list_clear(&local_40->acknowledgements);
            enet_list_clear(&local_40->sentReliableCommands);
            enet_list_clear(&local_40->outgoingCommands);
            enet_list_clear(&local_40->outgoingSendReliableCommands);
            enet_list_clear(&local_40->dispatchedCommands);
            enet_peer_reset(local_40);
          }
        }
      }
    }
  }
  else {
    address_local = (ENetAddress *)0x0;
  }
  return (ENetHost *)address_local;
}

Assistant:

ENetHost * enet_host_create(const ENetAddress *address, size_t peerCount, size_t channelLimit, enet_uint32 incomingBandwidth, enet_uint32 outgoingBandwidth) {
        ENetHost *host;
        ENetPeer *currentPeer;

        if (peerCount > ENET_PROTOCOL_MAXIMUM_PEER_ID) {
            return NULL;
        }

        host = (ENetHost *) enet_malloc(sizeof(ENetHost));
        if (host == NULL) { return NULL; }
        memset(host, 0, sizeof(ENetHost));

        host->peers = (ENetPeer *) enet_malloc(peerCount * sizeof(ENetPeer));
        if (host->peers == NULL) {
            enet_free(host);
            return NULL;
        }

        memset(host->peers, 0, peerCount * sizeof(ENetPeer));

        host->socket = enet_socket_create(ENET_SOCKET_TYPE_DATAGRAM);
        if (host->socket != ENET_SOCKET_NULL) {
            enet_socket_set_option (host->socket, ENET_SOCKOPT_IPV6_V6ONLY, 0);
        }

        if (host->socket == ENET_SOCKET_NULL || (address != NULL && enet_socket_bind(host->socket, address) < 0)) {
            if (host->socket != ENET_SOCKET_NULL) {
                enet_socket_destroy(host->socket);
            }

            enet_free(host->peers);
            enet_free(host);

            return NULL;
        }

        enet_socket_set_option(host->socket, ENET_SOCKOPT_NONBLOCK, 1);
        enet_socket_set_option(host->socket, ENET_SOCKOPT_BROADCAST, 1);
        enet_socket_set_option(host->socket, ENET_SOCKOPT_RCVBUF, ENET_HOST_RECEIVE_BUFFER_SIZE);
        enet_socket_set_option(host->socket, ENET_SOCKOPT_SNDBUF, ENET_HOST_SEND_BUFFER_SIZE);
        enet_socket_set_option(host->socket, ENET_SOCKOPT_IPV6_V6ONLY, 0);

        if (address != NULL && enet_socket_get_address(host->socket, &host->address) < 0) {
            host->address = *address;
        }

        if (!channelLimit || channelLimit > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT) {
            channelLimit = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;
        }

        host->randomSeed                    = (enet_uint32) ((uintptr_t) host % UINT32_MAX);
        host->randomSeed                    += enet_host_random_seed();
        host->randomSeed                    = (host->randomSeed << 16) | (host->randomSeed >> 16);
        host->channelLimit                  = channelLimit;
        host->incomingBandwidth             = incomingBandwidth;
        host->outgoingBandwidth             = outgoingBandwidth;
        host->bandwidthThrottleEpoch        = 0;
        host->recalculateBandwidthLimits    = 0;
        host->mtu                           = ENET_HOST_DEFAULT_MTU;
        host->peerCount                     = peerCount;
        host->commandCount                  = 0;
        host->bufferCount                   = 0;
        host->checksum                      = NULL;
        host->receivedAddress.host          = ENET_HOST_ANY;
        host->receivedAddress.port          = 0;
        host->receivedData                  = NULL;
        host->receivedDataLength            = 0;
        host->totalSentData                 = 0;
        host->totalSentPackets              = 0;
        host->totalReceivedData             = 0;
        host->totalReceivedPackets          = 0;
        host->totalQueued                   = 0;
        host->connectedPeers                = 0;
        host->bandwidthLimitedPeers         = 0;
        host->duplicatePeers                = ENET_PROTOCOL_MAXIMUM_PEER_ID;
        host->maximumPacketSize             = ENET_HOST_DEFAULT_MAXIMUM_PACKET_SIZE;
        host->maximumWaitingData            = ENET_HOST_DEFAULT_MAXIMUM_WAITING_DATA;
        host->compressor.context            = NULL;
        host->compressor.compress           = NULL;
        host->compressor.decompress         = NULL;
        host->compressor.destroy            = NULL;
        host->intercept                     = NULL;

        enet_list_clear(&host->dispatchQueue);

        for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
            currentPeer->host = host;
            currentPeer->incomingPeerID    = currentPeer - host->peers;
            currentPeer->outgoingSessionID = currentPeer->incomingSessionID = 0xFF;
            currentPeer->data = NULL;

            enet_list_clear(&currentPeer->acknowledgements);
            enet_list_clear(&currentPeer->sentReliableCommands);
            enet_list_clear(&currentPeer->outgoingCommands);
            enet_list_clear(&currentPeer->outgoingSendReliableCommands);
            enet_list_clear(&currentPeer->dispatchedCommands);

            enet_peer_reset(currentPeer);
        }

        return host;
    }